

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::TexCubeCompletenessCase::iterate(TexCubeCompletenessCase *this)

{
  RenderContext *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Surface *result;
  uint x;
  char *description;
  byte bVar5;
  uint y;
  CompareLogMode logMode;
  RGBA color;
  int face;
  CubeFace face_00;
  int height;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Random random;
  TextureRenderer renderer;
  vector<float,_std::allocator<float>_> local_108;
  Surface local_e8;
  TestLog *local_d0;
  TextureFormat local_c8;
  deRandom local_c0;
  TextureRenderer local_b0;
  Surface local_58;
  void *data;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)CONCAT44(extraout_var,iVar2);
  if (0x3f < iVar2) {
    iVar2 = 0x40;
  }
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 4);
  height = 0x40;
  if (iVar3 < 0x40) {
    height = iVar3;
  }
  local_d0 = this->m_testCtx->m_log;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&local_b0,this->m_renderCtx,local_d0,GLSL_VERSION_100_ES,PRECISION_MEDIUMP);
  tcu::Surface::Surface(&local_e8,iVar2,height);
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_c0,dVar4);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
  dVar4 = deRandom_getUint32(&local_c0);
  iVar3 = iVar3 + -0x40;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  x = dVar4 % (iVar3 + 1U);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_02,iVar3) + 4);
  dVar4 = deRandom_getUint32(&local_c0);
  iVar3 = iVar3 + -0x40;
  face_00 = CUBEFACE_NEGATIVE_X;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  y = dVar4 % (iVar3 + 1U);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])();
  bVar5 = 1;
  do {
    glu::TextureTestUtil::computeQuadTexCoordCube(&local_108,face_00);
    glwViewport(x,y,iVar2,height);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&local_b0,0,
               local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,TEXTURETYPE_CUBE);
    context = this->m_renderCtx;
    local_c8.order = RGBA;
    local_c8.type = UNORM_INT8;
    data = (void *)local_e8.m_pixels.m_cap;
    if ((void *)local_e8.m_pixels.m_cap != (void *)0x0) {
      data = local_e8.m_pixels.m_ptr;
    }
    logMode = COMPARE_LOG_RESULT;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_58,&local_c8,local_e8.m_width,local_e8.m_height,1,data);
    color.m_value = (deUint32)data;
    result = &local_58;
    glu::readPixels(context,x,y,(PixelBufferAccess *)&local_58);
    bVar1 = compareToConstantColor
                      (local_d0,(char *)&local_e8,(char *)(ulong)(this->m_compareColor).m_value,
                       result,logMode,color);
    bVar5 = bVar5 & bVar1;
    face_00 = face_00 + CUBEFACE_POSITIVE_X;
  } while (face_00 != CUBEFACE_LAST);
  description = "Image comparison failed";
  if (bVar5 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this->m_testCtx,(uint)(bVar5 ^ 1),description);
  if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_e8);
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer(&local_b0);
  return STOP;
}

Assistant:

TexCubeCompletenessCase::IterateResult TexCubeCompletenessCase::iterate (void)
{
	int					viewportWidth	= de::min(64, m_renderCtx.getRenderTarget().getWidth());
	int					viewportHeight	= de::min(64, m_renderCtx.getRenderTarget().getHeight());
	bool				allFacesOk		= true;
	TestLog&			log				= m_testCtx.getLog();
	TextureRenderer		renderer		(m_renderCtx, log, glu::GLSL_VERSION_100_ES, glu::PRECISION_MEDIUMP);
	tcu::Surface		renderedFrame	(viewportWidth, viewportHeight);
	vector<float>		texCoord;

	de::Random			random			(deStringHash(getName()));
	int					offsetX			= random.getInt(0, de::max(0,m_renderCtx.getRenderTarget().getWidth()	- 64));
	int					offsetY			= random.getInt(0, de::max(0,m_renderCtx.getRenderTarget().getHeight()	- 64));

	createTexture();

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		computeQuadTexCoordCube	(texCoord, (tcu::CubeFace)face);

		glViewport				(offsetX, offsetY, viewportWidth, viewportHeight);

		renderer.renderQuad		(0, &texCoord[0], glu::TextureTestUtil::TEXTURETYPE_CUBE);
		glu::readPixels			(m_renderCtx, offsetX, offsetY, renderedFrame.getAccess());

		bool isOk = compareToConstantColor(log, "Result", "Image comparison result", renderedFrame, tcu::COMPARE_LOG_RESULT, m_compareColor);

		if (!isOk)
			allFacesOk = false;
	}

	m_testCtx.setTestResult(allFacesOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							allFacesOk ? "Pass"					: "Image comparison failed");
	return STOP;
}